

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void dw3_male_merchant(dw_rom *rom)

{
  dw_rom *rom_local;
  
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4,3);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8,3);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39);
  vpatch(rom,0x1a8b,3,0x36,0x30,0x11);
  vpatch(rom,0x12300,0x80,1,6,0x49,0x47,0x48,0x47,0x4f,0x67,0x46,0x49,7,0x49,0x47,0x4a,0x42,1,0x80,
         0x60,0x90,0xe0,0x10,0xe0,0xf0,0xe0,0x60,0x90,0xe0,0x90,0xe0,0x50,0x40,0x80,0x7b,0x7e,0x5d,
         0x5b,0x40,0,0xe,0,7,0x49,0x5e,0x5d,0x1f,0x1f,0xe,0,0xcc,0x3e,0xbe,0xf8,0x38,0,0,0xf8,0xf0,
         0xf0,0x78,0x80,0xc0,0xf8,0xf0,0xf8,1,6);
  vpatch(rom,0x12400,0x180,0,7,0x18,0x1f,0x20,0x2f,0x2f,0x2f,7,8,0x3f,0x38,0xf,0x24,0x24,0x28,0xc0,
         0x20,0xc0,0x30,0xc0,0x30,0xc0,0xc0,0,0xc0,0x30,0xc0,0x30,0xc0,0x20,0,0xc,0x33,0x3b,0x2f,
         0x23,0x20,0x3e,0,0xf,7,6,0x2c,0x2c,0x2f,0x1e,0,0,0xe0,0xf0,0xf0,0x80,0,0x18,0xf0,0xe0,0x30,
         0x70,0x70,0x70,0xf0,0xf8,0xf0,0,7);
  return;
}

Assistant:

static void dw3_male_merchant(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x30,  0x11);
    vpatch(rom, 0x12300,  128,  0x01,  0x06,  0x49,  0x47,  0x48,  0x47,  0x4f,  0x67,  0x46,  0x49,  0x07,  0x49,  0x47,  0x4a,  0x42,  0x01,  0x80,  0x60,  0x90,  0xe0,  0x10,  0xe0,  0xf0,  0xe0,  0x60,  0x90,  0xe0,  0x90,  0xe0,  0x50,  0x40,  0x80,  0x7b,  0x7e,  0x5d,  0x5b,  0x40,  0x00,  0x0e,  0x00,  0x07,  0x49,  0x5e,  0x5d,  0x1f,  0x1f,  0x0e,  0x00,  0xcc,  0x3e,  0xbe,  0xf8,  0x38,  0x00,  0x00,  0xf8,  0xf0,  0xf0,  0x78,  0x80,  0xc0,  0xf8,  0xf0,  0xf8,  0x01,  0x06,  0x09,  0x07,  0x48,  0x47,  0x4f,  0x47,  0x06,  0x09,  0x47,  0x49,  0x07,  0x4a,  0x42,  0x41,  0x80,  0x60,  0x90,  0xe0,  0x10,  0xe0,  0xf0,  0xe0,  0x60,  0x90,  0xe0,  0x90,  0xe0,  0x50,  0x40,  0x80,  0x5b,  0x7e,  0x7d,  0x5b,  0x40,  0x40,  0x40,  0x1f,  0x47,  0x19,  0x1e,  0x5d,  0x4f,  0x5f,  0x0f,  0x1f,  0xc8,  0x3c,  0xbc,  0xf8,  0x38,  0x00,  0x70,  0x00,  0xf0,  0xf0,  0x60,  0x80,  0xc0,  0xf8,  0x70,  0x00);
    vpatch(rom, 0x12400,  384,  0x00,  0x07,  0x18,  0x1f,  0x20,  0x2f,  0x2f,  0x2f,  0x07,  0x08,  0x3f,  0x38,  0x0f,  0x24,  0x24,  0x28,  0xc0,  0x20,  0xc0,  0x30,  0xc0,  0x30,  0xc0,  0xc0,  0x00,  0xc0,  0x30,  0xc0,  0x30,  0xc0,  0x20,  0x00,  0x0c,  0x33,  0x3b,  0x2f,  0x23,  0x20,  0x3e,  0x00,  0x0f,  0x07,  0x06,  0x2c,  0x2c,  0x2f,  0x1e,  0x00,  0x00,  0xe0,  0xf0,  0xf0,  0x80,  0x00,  0x18,  0xf0,  0xe0,  0x30,  0x70,  0x70,  0x70,  0xf0,  0xf8,  0xf0,  0x00,  0x07,  0x58,  0x5f,  0x40,  0x4f,  0x4f,  0x6f,  0x47,  0x48,  0x1f,  0x58,  0x4f,  0x44,  0x44,  0x08,  0xc0,  0x20,  0xc0,  0x30,  0xc0,  0x30,  0xc0,  0xc0,  0x00,  0xc0,  0x30,  0xc0,  0x30,  0xc0,  0x20,  0x00,  0x7c,  0x63,  0x4b,  0x4f,  0x43,  0x00,  0x00,  0x0f,  0x0f,  0x47,  0x47,  0x4c,  0x04,  0x0f,  0x07,  0x0f,  0x00,  0xe0,  0xf0,  0xf0,  0x80,  0x08,  0x18,  0xc0,  0xe0,  0x30,  0x90,  0x10,  0x70,  0xf8,  0xd8,  0xc0,  0x03,  0x04,  0x03,  0x0c,  0x03,  0x0c,  0x03,  0x03,  0x00,  0x03,  0x0c,  0x03,  0x0c,  0x03,  0x04,  0x00,  0x00,  0xe0,  0x1c,  0xfc,  0x04,  0xf4,  0xf4,  0xfc,  0xe4,  0x14,  0xf8,  0x1c,  0xf4,  0x24,  0x24,  0x10,  0x04,  0x07,  0x0f,  0x0f,  0x00,  0x00,  0x18,  0x0f,  0x03,  0x0c,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x0f,  0x3c,  0xf4,  0xd4,  0xfc,  0x1c,  0x00,  0x78,  0x00,  0xe0,  0xc4,  0x34,  0xc4,  0xe0,  0xf0,  0x78,  0x00,  0x03,  0x04,  0x03,  0x0c,  0x03,  0x0c,  0x03,  0x03,  0x00,  0x03,  0x0c,  0x03,  0x0c,  0x03,  0x04,  0x00,  0x00,  0xe0,  0x18,  0xf8,  0x04,  0xf4,  0xf4,  0xf4,  0xe0,  0x10,  0xfc,  0x1c,  0xf0,  0x24,  0x24,  0x14,  0x04,  0x07,  0x0f,  0x0f,  0x00,  0x10,  0x18,  0x03,  0x03,  0x0c,  0x0f,  0x0f,  0x0f,  0x1f,  0x1b,  0x03,  0x34,  0xdc,  0xdc,  0xfc,  0x1c,  0x04,  0x04,  0xf0,  0xf4,  0xe0,  0x30,  0xc4,  0xe4,  0xf4,  0xe0,  0xf0,  0x01,  0x06,  0x09,  0x06,  0x09,  0x06,  0x09,  0x06,  0x06,  0x09,  0x06,  0x09,  0x06,  0x09,  0x06,  0x01,  0x80,  0x60,  0x92,  0x62,  0x92,  0x62,  0x92,  0x66,  0x62,  0x92,  0x60,  0x92,  0x62,  0x92,  0x62,  0x80,  0x37,  0x7f,  0x7f,  0x3f,  0x30,  0x00,  0x0e,  0x00,  0x0e,  0x0f,  0x1c,  0x03,  0x0f,  0x1f,  0x0e,  0x00,  0xf6,  0xfe,  0xfa,  0xfa,  0x02,  0x00,  0x00,  0xf8,  0x68,  0x9a,  0x7a,  0xfa,  0xf0,  0xf8,  0xf0,  0xf8,  0x01,  0x06,  0x09,  0x06,  0x09,  0x06,  0x09,  0x06,  0x06,  0x09,  0x06,  0x09,  0x06,  0x09,  0x06,  0x01,  0x80,  0x60,  0x90,  0x60,  0x92,  0x62,  0x92,  0x62,  0x60,  0x90,  0x62,  0x92,  0x60,  0x92,  0x62,  0x82,  0x17,  0x3f,  0x1f,  0x1f,  0x18,  0x00,  0x00,  0x1f,  0x0e,  0x1f,  0x1c,  0x03,  0x07,  0x1f,  0x0f,  0x1f,  0xf2,  0xfe,  0xfe,  0xfa,  0x02,  0x02,  0x72,  0x00,  0x6a,  0x98,  0x78,  0xfa,  0xfa,  0xfa,  0x70,  0x00);
}